

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__fill_bits(stbi__zbuf *z)

{
  byte bVar1;
  stbi__zbuf *z_local;
  
  do {
    if ((uint)(1 << ((byte)z->num_bits & 0x1f)) <= z->code_buffer) {
      z->zbuffer = z->zbuffer_end;
      return;
    }
    bVar1 = stbi__zget8(z);
    z->code_buffer = (uint)bVar1 << ((byte)z->num_bits & 0x1f) | z->code_buffer;
    z->num_bits = z->num_bits + 8;
  } while (z->num_bits < 0x19);
  return;
}

Assistant:

static void stbi__fill_bits(stbi__zbuf *z)
{
   do {
      if (z->code_buffer >= (1U << z->num_bits)) {
        z->zbuffer = z->zbuffer_end;  /* treat this as EOF so we fail. */
        return;
      }
      z->code_buffer |= (unsigned int) stbi__zget8(z) << z->num_bits;
      z->num_bits += 8;
   } while (z->num_bits <= 24);
}